

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhosttx.cpp
# Opt level: O0

osfildef * __thiscall
CVmHostIfcText::find_resource
          (CVmHostIfcText *this,char *resname,size_t resnamelen,unsigned_long *res_size)

{
  int iVar1;
  CVmHashEntry *path;
  FILE *__stream;
  long lVar2;
  long *in_RCX;
  ulong in_RDX;
  void *in_RSI;
  long *in_RDI;
  CResEntry *entry;
  char res_dir [4096];
  char fname_buf [4096];
  char *fname;
  char buf [4096];
  osfildef *fp;
  char in_stack_ffffffffffffcfb8;
  undefined7 in_stack_ffffffffffffcfb9;
  char *in_stack_ffffffffffffcfc0;
  CVmHashTable *in_stack_ffffffffffffcfc8;
  char *in_stack_ffffffffffffcfd0;
  size_t in_stack_ffffffffffffcfd8;
  char *in_stack_ffffffffffffcfe0;
  char local_2048 [4104];
  char *local_1040;
  int in_stack_ffffffffffffefc8;
  int in_stack_ffffffffffffefcc;
  char *in_stack_ffffffffffffefd0;
  char *in_stack_ffffffffffffefd8;
  size_t local_20;
  FILE *local_8;
  
  memset(&stack0xffffffffffffcfb8,0,0x1000);
  if (in_RDI[5] == 0) {
    if (*(long *)in_RDI[2] != 0) {
      os_get_path_name(in_stack_ffffffffffffcfe0,in_stack_ffffffffffffcfd8,in_stack_ffffffffffffcfd0
                      );
    }
  }
  else {
    lib_strcpy(in_stack_ffffffffffffcfd0,(size_t)in_stack_ffffffffffffcfc8,in_stack_ffffffffffffcfc0
              );
  }
  path = CVmHashTable::find(in_stack_ffffffffffffcfc8,in_stack_ffffffffffffcfc0,
                            CONCAT71(in_stack_ffffffffffffcfb9,in_stack_ffffffffffffcfb8));
  if (path == (CVmHashEntry *)0x0) {
    iVar1 = (**(code **)(*in_RDI + 0x10))();
    if (3 < iVar1) {
      return (osfildef *)0x0;
    }
    local_20 = in_RDX;
    if (0xfff < in_RDX) {
      local_20 = 0xfff;
    }
    memcpy(&stack0xffffffffffffefc8,in_RSI,local_20);
    (&stack0xffffffffffffefc8)[local_20] = 0;
    os_cvt_url_dir(local_2048,0x1000,&stack0xffffffffffffefc8);
    local_1040 = local_2048;
    iVar1 = os_is_file_absolute((char *)in_RDI);
    if (iVar1 != 0) {
      return (osfildef *)0x0;
    }
    if ((in_stack_ffffffffffffcfb8 == '\0') ||
       (iVar1 = os_is_file_in_dir(in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0,
                                  in_stack_ffffffffffffefcc,in_stack_ffffffffffffefc8), iVar1 == 0))
    {
      return (osfildef *)0x0;
    }
  }
  else {
    if (path[1].str_ == (char *)0x0) {
      __stream = fopen(*(char **)(in_RDI[2] + (long)*(int *)&path->field_0x24 * 8),"rb");
      if (__stream != (FILE *)0x0) {
        fseek(__stream,(long)path[1]._vptr_CVmHashEntry,0);
      }
      *in_RCX = (long)path[1].nxt_;
      return (osfildef *)__stream;
    }
    local_1040 = path[1].str_;
  }
  iVar1 = os_is_file_absolute((char *)in_RDI);
  if (iVar1 == 0) {
    if (in_stack_ffffffffffffcfb8 == '\0') {
      return (osfildef *)0x0;
    }
    os_build_full_path(in_stack_ffffffffffffcfc0,
                       CONCAT71(in_stack_ffffffffffffcfb9,in_stack_ffffffffffffcfb8),(char *)path,
                       (char *)in_RDI);
  }
  else {
    lib_strcpy(in_stack_ffffffffffffcfd0,(size_t)in_stack_ffffffffffffcfc8,in_stack_ffffffffffffcfc0
              );
  }
  local_8 = fopen(&stack0xffffffffffffefc8,"rb");
  if (local_8 == (FILE *)0x0) {
    local_8 = (FILE *)0x0;
  }
  else {
    fseek(local_8,0,2);
    lVar2 = ftell(local_8);
    *in_RCX = lVar2;
    fseek(local_8,0,0);
  }
  return (osfildef *)local_8;
}

Assistant:

osfildef *CVmHostIfcText::find_resource(const char *resname,
                                        size_t resnamelen,
                                        unsigned long *res_size)
{
    osfildef *fp;
    char buf[OSFNMAX];
    char *fname;
    char fname_buf[OSFNMAX];
    char res_dir[OSFNMAX] = "";

    /* 
     *   get the resource directory - if there's an explicit resource path
     *   specified, use that, otherwise use the image file folder 
     */
    if (res_dir_ != 0)
        lib_strcpy(res_dir, sizeof(res_dir), res_dir_);
    else if (ext_[0] != 0)
        os_get_path_name(res_dir, sizeof(res_dir), ext_[0]);

    /* try finding an entry in the resource map */
    CResEntry *entry = (CResEntry *)restab_->find(resname, resnamelen);
    if (entry != 0)
    {
        /* found it - check the type */
        if (entry->link_ == 0)
        {
            /* it's a stored binary resource - load it */
            fp = osfoprb(ext_[entry->fileno_], OSFTBIN);
            
            /* if that succeeded, seek to the start of the resource */
            if (fp != 0)
                osfseek(fp, entry->ofs_, OSFSK_SET);
            
            /* tell the caller the size of the resource */
            *res_size = entry->siz_;
            
            /* return the file handle */
            return fp;
        }
        else
        {
            /* it's a link to a local file */
            fname = entry->link_;
        }
    }
    else
    {
        /* 
         *   There's no entry in the resource map, so convert the resource
         *   name from the URL notation to local file system conventions, and
         *   look for a file with the given name.  This is allowed only if
         *   the file safety level setting is 3 (read only local directory
         *   access) or lower.  
         */
        if (get_io_safety_read() > 3)
            return 0;
        
        /*   
         *   Make a null-terminated copy of the resource name, limiting the
         *   copy to our buffer size.  
         */
        if (resnamelen > sizeof(buf) - 1)
            resnamelen = sizeof(buf) - 1;
        memcpy(buf, resname, resnamelen);
        buf[resnamelen] = '\0';

        /* convert the resource name to a URL */
        os_cvt_url_dir(fname_buf, sizeof(fname_buf), buf);
        fname = fname_buf;

        /* if that yields an absolute path, it's an error */
        if (os_is_file_absolute(fname))
            return 0;

        /* 
         *   If it's not in the resource file folder, it's also an error - we
         *   don't allow paths to parent folders via "..", for example.  If
         *   we don't have an resource file folder to compare it to, fail,
         *   since we can't properly sandbox it.  Resource files are always
         *   sandboxed to the resource directory, even if the file safety
         *   settings are less restrictive.
         */
        if (res_dir[0] == 0
            || !os_is_file_in_dir(fname, res_dir, TRUE, FALSE))
            return 0;
    }

    /* 
     *   If we get this far, it's because we have a local file name in
     *   'fname' that we need to look up.  
     */

    /* check the path for relativity */
    if (os_is_file_absolute(fname))
    {
        /* it's already an absolute, fully-qualified path - use it as-is */
        lib_strcpy(buf, sizeof(buf), fname);
    }
    else
    {
        /* 
         *   it's a relative path - make sure we have a resource directory
         *   for it to be relative to 
         */
        if (res_dir[0] == 0)
            return 0;

        /* 
         *   build the full path name by combining the image file path with
         *   the relative path we got from the resource name URL, as
         *   converted local file system conventions 
         */
        os_build_full_path(buf, sizeof(buf), res_dir, fname);
    }

    /* try opening the file */
    fp = osfoprb(buf, OSFTBIN);

    /* return failure if we couldn't find the file */
    if (fp == 0)
        return 0;

    /* 
     *   the entire file is the resource data, so figure out how big the file
     *   is, and tell the caller that the resource size is the file size 
     */
    osfseek(fp, 0, OSFSK_END);
    *res_size = osfpos(fp);

    /* 
     *   seek back to the start of the resource data (which is simply the
     *   start of the file, since the entire file is the resource data) 
     */
    osfseek(fp, 0, OSFSK_SET);
        
    /* return the file handle */
    return fp;
}